

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O1

Result __thiscall
tonk::SessionIncoming::onCompressed(SessionIncoming *this,uint8_t *data,uint bytes)

{
  RefCounter *pRVar1;
  Decompressed *in_RCX;
  Result *success;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  Result decompressResult;
  Decompressed decompressed;
  undefined1 local_68 [16];
  long local_58;
  undefined1 local_50 [16];
  long local_40;
  uint local_38;
  
  if ((int)in_RCX == 0) {
    (this->Deps).ConnectionRef = (RefCounter *)0x0;
  }
  else {
    MessageDecompressor::Decompress((MessageDecompressor *)local_68,data + 0x4b8,bytes,in_RCX);
    if ((RefCounter *)local_68._0_8_ == (RefCounter *)0x0) {
      uVar2 = 0;
      if (1 < local_38) {
        uVar4 = 0;
        do {
          iVar3 = (int)uVar4 + 2;
          uVar2 = *(ushort *)(local_40 + uVar4) & 0x7ff;
          if (local_38 - iVar3 < uVar2) {
            local_68._8_8_ = local_50;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_68 + 8),"Truncated message","");
            pRVar1 = (RefCounter *)operator_new(0x38);
            *(char **)pRVar1 = "SessionIncoming::decompress";
            (pRVar1->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar1->ShutdownJson).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pRVar1->ShutdownJson,local_68._8_8_,
                       (undefined1 *)(local_68._8_8_ + local_58));
            goto LAB_00129650;
          }
          deliverMessage(this,(uint)data,(uint8_t *)(ulong)(*(ushort *)(local_40 + uVar4) >> 0xb),
                         iVar3 + (int)local_40);
          if ((this->Deps).ConnectionRef != (RefCounter *)0x0) goto LAB_001294fc;
          uVar2 = iVar3 + uVar2;
          uVar4 = (ulong)uVar2;
          Result::~Result((Result *)this);
        } while (1 < local_38 - uVar2);
      }
      if (local_38 == uVar2) {
        (this->Deps).ConnectionRef = (RefCounter *)0x0;
      }
      else {
        local_68._8_8_ = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_68 + 8),"Invalid frame","")
        ;
        pRVar1 = (RefCounter *)operator_new(0x38);
        *(char **)pRVar1 = "SessionIncoming::decompress";
        (pRVar1->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar1->ShutdownJson).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar1->ShutdownJson,local_68._8_8_,
                   (undefined1 *)(local_68._8_8_ + local_58));
LAB_00129650:
        (pRVar1->RefCount).super___atomic_base<int>._M_i = 0;
        (pRVar1->ShutdownLock).super___mutex_base._M_mutex.__align = 9;
        (this->Deps).ConnectionRef = pRVar1;
        if ((undefined1 *)local_68._8_8_ != local_50) {
          operator_delete((void *)local_68._8_8_);
        }
      }
    }
    else {
      (this->Deps).ConnectionRef = (RefCounter *)local_68._0_8_;
      local_68._0_8_ = (RefCounter *)0x0;
    }
LAB_001294fc:
    Result::~Result((Result *)local_68);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionIncoming::onCompressed(
    const uint8_t* data,
    unsigned bytes)
{
    if (bytes <= 0) {
        return Result::Success();
    }

    Decompressed decompressed;
    Result decompressResult = Decompressor.Decompress(
        data,
        bytes,
        decompressed);
    if (decompressResult.IsFail()) {
        return decompressResult;
    }

    siamese::ReadByteStream frameReader(decompressed.Data, decompressed.Bytes);

    // Process all messages contained in the compressed payload:
    while (frameReader.Remaining() >= protocol::kMessageFrameBytes)
    {
        // Read message frame header
        unsigned messageType = frameReader.Read16();
        const unsigned messageBytes = messageType & protocol::kMessageLengthMask;

        if (frameReader.Remaining() < messageBytes) {
            TONK_DEBUG_BREAK();
            return Result("SessionIncoming::decompress", "Truncated message", ErrorType::Tonk, Tonk_InvalidData);
        }

        messageType >>= protocol::kMessageLengthBits;
        const uint8_t* messageData = frameReader.Read(messageBytes);

        TONK_DEBUG_ASSERT(messageType >= protocol::MessageType_StartOfReliables);
        TONK_DEBUG_ASSERT(messageType != protocol::MessageType_Unordered);

        const Result deliveryResult = deliverMessage(messageType, messageData, messageBytes);
        if (deliveryResult.IsFail()) {
            return deliveryResult;
        }
    }

    // If the message payload was not completely used:
    if (frameReader.Remaining() > 0) {
        TONK_DEBUG_BREAK(); // Invalid data
        return Result("SessionIncoming::decompress", "Invalid frame", ErrorType::Tonk, Tonk_InvalidData);
    }

    return Result::Success();
}